

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_7::Validator::OnMemoryDropExpr(Validator *this,MemoryDropExpr *expr)

{
  Location *loc;
  Index local_1c [2];
  Index index;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)24>).super_Expr.loc;
  this->expr_loc_ = loc;
  CheckHasMemory(this,loc,(Opcode)0xc6);
  CheckVar(this,(Index)((ulong)((long)(this->current_module_->data_segments).
                                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->current_module_->data_segments).
                                     super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3),&expr->var,
           "data_segment",local_1c);
  if ((expr->var).type_ == Index) {
    TypeChecker::OnMemoryDrop(&this->typechecker_,(expr->var).field_2.index_);
    return (Result)Ok;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                ,0x36,"Index wabt::Var::index() const");
}

Assistant:

Result Validator::OnMemoryDropExpr(MemoryDropExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckHasMemory(&expr->loc, Opcode::MemoryDrop);
  CheckDataSegmentVar(&expr->var);
  typechecker_.OnMemoryDrop(expr->var.index());
  return Result::Ok;
}